

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

void ImGui::RenderFrame(ImVec2 p_min,ImVec2 p_max,ImU32 fill_col,bool border,float rounding)

{
  float thickness;
  ImGuiWindow *pIVar1;
  ImDrawList *pIVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  ImGuiContext *pIVar7;
  ImU32 IVar8;
  undefined7 in_register_00000031;
  undefined4 in_XMM1_Dc;
  undefined4 in_XMM1_Dd;
  ImVec2 local_78;
  ImVec2 local_70;
  ImVec4 local_68;
  undefined1 local_58 [24];
  ImVec2 local_40;
  ImVec2 local_38;
  
  pIVar7 = GImGui;
  pIVar1 = GImGui->CurrentWindow;
  local_78.x = p_min.x + 1.0;
  local_78.y = p_min.y + 0.0;
  local_58._8_4_ = in_XMM1_Dc;
  local_58._0_8_ = p_max;
  local_58._12_4_ = in_XMM1_Dd;
  local_68.y = p_max.y + -0.1;
  local_68.x = p_max.x + -0.1;
  local_70 = p_max;
  ImDrawList::AddRectFilled(pIVar1->DrawList,&local_78,(ImVec2 *)&local_68,fill_col,rounding,0xf);
  if (((int)CONCAT71(in_register_00000031,border) != 0) &&
     (thickness = (pIVar7->Style).FrameBorderSize, 0.0 < thickness)) {
    pIVar2 = pIVar1->DrawList;
    local_38.y = local_78.y + 1.0;
    local_38.x = local_78.x + 1.0;
    local_40.y = (float)local_58._4_4_ + 1.0;
    local_40.x = (float)local_58._0_4_ + 1.0;
    local_68.x = (GImGui->Style).Colors[6].x;
    local_68.y = (GImGui->Style).Colors[6].y;
    uVar3 = (GImGui->Style).Colors[6].z;
    uVar4 = (GImGui->Style).Colors[6].w;
    local_68.w = (GImGui->Style).Alpha * (float)uVar4;
    local_68.z = (float)uVar3;
    IVar8 = ColorConvertFloat4ToU32(&local_68);
    ImDrawList::AddRect(pIVar2,&local_38,&local_40,IVar8,rounding,0xf,thickness);
    pIVar2 = pIVar1->DrawList;
    local_68.x = (GImGui->Style).Colors[5].x;
    local_68.y = (GImGui->Style).Colors[5].y;
    uVar5 = (GImGui->Style).Colors[5].z;
    uVar6 = (GImGui->Style).Colors[5].w;
    local_68.w = (GImGui->Style).Alpha * (float)uVar6;
    local_68.z = (float)uVar5;
    IVar8 = ColorConvertFloat4ToU32(&local_68);
    ImDrawList::AddRect(pIVar2,&local_78,&local_70,IVar8,rounding,0xf,thickness);
  }
  return;
}

Assistant:

void ImGui::RenderFrame(ImVec2 p_min, ImVec2 p_max, ImU32 fill_col, bool border, float rounding)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;
    //window->DrawList->AddRectFilled(p_min, p_max, fill_col, rounding);
    p_min = p_min + ImVec2(1.0, 0.0);
    window->DrawList->AddRectFilled(p_min, p_max-ImVec2(+0.1,0.1), fill_col, rounding);
    const float border_size = g.Style.FrameBorderSize;
    if (border && border_size > 0.0f)
    {
        window->DrawList->AddRect(p_min + ImVec2(1, 1), p_max + ImVec2(1, 1), GetColorU32(ImGuiCol_BorderShadow), rounding, ImDrawCornerFlags_All, border_size);
        window->DrawList->AddRect(p_min, p_max, GetColorU32(ImGuiCol_Border), rounding, ImDrawCornerFlags_All, border_size);
    }
}